

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filenames.c
# Opt level: O3

void test_ustar_filenames(void)

{
  uint dlen;
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0x5a;
  dlen = 5;
  do {
    iVar1 = 0;
    do {
      test_filename((char *)0x0,dlen,iVar2 + iVar1);
      test_filename("/",dlen,iVar2 + iVar1);
      iVar1 = iVar1 + 1;
    } while (iVar1 != 10);
    iVar2 = iVar2 + -5;
    bVar3 = dlen < 0x41;
    dlen = dlen + 5;
  } while (bVar3);
  iVar2 = 0x5a;
  do {
    test_filename((char *)0x0,0,iVar2);
    test_filename("/",0x46,iVar2);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x6e);
  return;
}

Assistant:

DEFINE_TEST(test_ustar_filenames)
{
	int dlen, flen;

	/* Try a bunch of different file/dir lengths that add up
	 * to just a little less or a little more than 100 bytes.
	 * This exercises the code that splits paths between ustar
	 * filename and prefix fields.
	 */
	for (dlen = 5; dlen < 70; dlen += 5) {
		for (flen = 100 - dlen - 5; flen < 100 - dlen + 5; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	/* Probe the 100-char limit for paths with no '/'. */
	for (flen = 90; flen < 110; flen++) {
		test_filename(NULL, 0, flen);
		test_filename("/", dlen, flen);
	}

	/* XXXX TODO Probe the 100-char limit with a dir prefix. */
	/* XXXX TODO Probe the 255-char total limit. */
}